

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,vector<bool,_std::allocator<bool>_> *hadit,aiNode *nd,aiMatrix4x4 *absTrafo)

{
  ulong *puVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  aiMesh *paVar4;
  aiBone *paVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> *pvVar23
  ;
  int iVar24;
  aiNode **ppaVar25;
  aiNode *this_00;
  size_t sVar26;
  aiMatrix4x4t<float> *paVar27;
  aiScene *paVar28;
  ulong uVar29;
  char *pcVar30;
  pointer pTVar31;
  ulong uVar32;
  uint uVar33;
  pointer pTVar34;
  ulong uVar35;
  aiNode *paVar36;
  long lVar37;
  vector<bool,_std::allocator<bool>_> *pvVar38;
  float fVar39;
  float fVar40;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  aiMatrix4x4t<float> temp;
  undefined1 local_228 [24];
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  *local_1d8;
  ulong local_1d0;
  vector<bool,_std::allocator<bool>_> *local_1c8;
  MS3DImporter *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  aiNode *local_180;
  ulong local_178;
  ulong local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  aiMatrix4x4 *local_130;
  char *local_128;
  ulong local_120;
  ulong local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  pointer local_78;
  size_type sStack_70;
  size_type local_68;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pTVar34 = (joints->
            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar37 = (long)(joints->
                 super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar34;
  local_1d8 = joints;
  local_1c8 = hadit;
  local_1c0 = this;
  local_180 = nd;
  local_130 = absTrafo;
  if (lVar37 == 0) {
    uVar33 = 0;
  }
  else {
    lVar37 = (lVar37 >> 4) * 0x2e8ba2e8ba2e8ba3;
    p_Var3 = (hadit->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    pcVar30 = pTVar34->parentName;
    uVar33 = 0;
    uVar35 = 0;
    do {
      uVar29 = uVar35 + 0x3f;
      if (-1 < (long)uVar35) {
        uVar29 = uVar35;
      }
      if ((p_Var3[((long)uVar29 >> 6) +
                  (ulong)((uVar35 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar35 & 0x3f) & 1) == 0) {
        iVar24 = strcmp(pcVar30,(nd->mName).data);
        uVar33 = uVar33 + (iVar24 == 0);
      }
      uVar35 = uVar35 + 1;
      pcVar30 = pcVar30 + 0xb0;
    } while (lVar37 + (ulong)(lVar37 == 0) != uVar35);
  }
  paVar36 = local_180;
  local_180->mNumChildren = uVar33;
  ppaVar25 = (aiNode **)operator_new__((ulong)uVar33 << 3);
  paVar36->mChildren = ppaVar25;
  pTVar34 = (local_1d8->
            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pTVar31 = (local_1d8->
            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar31 != pTVar34) {
    local_128 = (paVar36->mName).data;
    local_1d0 = 0;
    uVar35 = 0x800000000000003f;
    uVar29 = 0;
    local_178 = 0x800000000000003f;
    pvVar38 = local_1c8;
    do {
      uVar32 = uVar29 + 0x3f;
      if (-1 < (long)uVar29) {
        uVar32 = uVar29;
      }
      local_110 = ((long)uVar32 >> 6) * 8;
      local_118 = (ulong)((uVar29 & uVar35) < 0x8000000000000001);
      local_120 = 1L << ((byte)uVar29 & 0x3f);
      local_170 = uVar29;
      if (((pvVar38->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar32 >> 6) + local_118 + 0xffffffffffffffff] >> (uVar29 & 0x3f) & 1) == 0) {
        iVar24 = strcmp(pTVar34[uVar29].parentName,local_128);
        uVar35 = local_178;
        pvVar38 = local_1c8;
        if (iVar24 == 0) {
          pTVar31 = pTVar34 + uVar29;
          this_00 = (aiNode *)operator_new(0x478);
          local_228._0_8_ = local_228 + 0x10;
          if (pTVar34 == (pointer)0x0) {
            pcVar30 = (char *)0x1;
          }
          else {
            sVar26 = strlen(pTVar31->name);
            pcVar30 = pTVar31->name + sVar26;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pTVar31,pcVar30);
          aiNode::aiNode(this_00,(string *)local_228);
          paVar36->mChildren[local_1d0 & 0xffffffff] = this_00;
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_);
          }
          this_00->mParent = paVar36;
          pTVar34 = (local_1d8->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          fVar55 = pTVar34[uVar29].position.x;
          fVar53 = pTVar34[uVar29].position.y;
          _local_198 = ZEXT416((uint)pTVar34[uVar29].position.z);
          local_1b8 = pTVar34[uVar29].rotation.x;
          local_1e8 = pTVar34[uVar29].rotation.y;
          local_1a8 = pTVar34[uVar29].rotation.z;
          local_148 = cosf(local_1b8);
          local_1b8 = sinf(local_1b8);
          fStack_1b4 = extraout_XMM0_Db;
          local_158 = cosf(local_1e8);
          local_1e8 = sinf(local_1e8);
          fStack_1e4 = extraout_XMM0_Db_00;
          fStack_1e0 = extraout_XMM0_Dc;
          fStack_1dc = extraout_XMM0_Dd;
          local_168 = cosf(local_1a8);
          fStack_164 = extraout_XMM0_Db_01;
          fVar39 = sinf(local_1a8);
          fVar41 = local_1e8 * local_168 * local_1b8 - local_148 * fVar39;
          fVar42 = fVar39 * local_1b8 + local_148 * local_1e8 * local_168;
          fVar46 = local_168 * local_148 + local_1b8 * fVar39 * local_1e8;
          fVar40 = fVar39 * local_1e8 * local_148 - local_1b8 * local_168;
          fVar54 = local_1b8 * local_158;
          fVar51 = local_148 * local_158;
          fVar47 = fVar40 * 0.0;
          fVar50 = fVar51 * 0.0;
          fStack_13c = fVar55 * 0.0;
          fVar45 = fVar42 + fVar47 + fVar50 + fStack_13c;
          fVar55 = fVar55 + 0.0;
          fVar42 = fVar42 * 0.0;
          fStack_1ac = fVar53 * 0.0;
          fVar40 = fVar40 + fVar42 + fVar50 + fStack_1ac;
          fVar53 = fVar53 + 0.0;
          fVar42 = fVar42 + fVar47;
          fVar48 = local_158 * fVar39 * 0.0;
          fVar49 = fVar46 * 0.0;
          fVar47 = -local_1e8 * 0.0;
          fVar43 = fVar54 * 0.0;
          fVar44 = fStack_1b4 * 0.0;
          local_148 = fStack_13c + local_158 * local_168 + fVar48 + fVar47;
          fStack_144 = fStack_13c + fVar41 + fVar49 + fVar43;
          fStack_140 = fStack_13c + -fStack_1e4 * 0.0 + 0.0;
          fStack_13c = fStack_13c + fStack_1e4 + fStack_164 * 0.0 + fVar44;
          fStack_19c = (float)local_198._0_4_ * 0.0;
          fVar52 = fVar51 + fVar42 + fStack_19c;
          (this_00->mTransformation).a1 = local_148;
          (this_00->mTransformation).a2 = fStack_144;
          (this_00->mTransformation).a3 = fVar45;
          (this_00->mTransformation).a4 = fVar55;
          fVar51 = local_158 * local_168 * 0.0;
          fVar41 = fVar41 * 0.0;
          local_1b8 = fStack_1ac + local_158 * fVar39 + fVar51 + fVar47;
          fStack_1b4 = fStack_1ac + fVar46 + fVar41 + fVar43;
          fStack_1b0 = fStack_1ac + -fStack_1e4 * 0.0 + 0.0;
          fStack_1ac = fStack_1ac + fStack_164 + fStack_1e4 * 0.0 + fVar44;
          (this_00->mTransformation).b1 = local_1b8;
          (this_00->mTransformation).b2 = fStack_1b4;
          (this_00->mTransformation).b3 = fVar40;
          (this_00->mTransformation).b4 = fVar53;
          fVar51 = fVar51 + fVar48;
          fVar41 = fVar41 + fVar49;
          local_1a8 = fStack_19c + (fVar51 - local_1e8);
          fStack_1a4 = fStack_19c + fVar54 + fVar41;
          fStack_1a0 = fStack_19c + (0.0 - fStack_1e0);
          fStack_19c = fStack_19c + ((fStack_1e4 * 0.0 + fStack_164 * 0.0) - fStack_1dc);
          (this_00->mTransformation).c1 = local_1a8;
          (this_00->mTransformation).c2 = fStack_1a4;
          (this_00->mTransformation).c3 = fVar52;
          fVar39 = (float)local_198._0_4_ + 0.0;
          fStack_b4 = fVar51 + fVar47 + 0.0;
          fStack_b0 = fVar41 + fVar43 + 0.0;
          fStack_1e4 = fVar42 + fVar50 + 0.0;
          (this_00->mTransformation).c4 = fVar39;
          (this_00->mTransformation).d1 = fStack_b4;
          (this_00->mTransformation).d2 = fStack_b0;
          (this_00->mTransformation).d3 = fStack_1e4;
          (this_00->mTransformation).d4 = 1.0;
          uVar7 = local_130->a1;
          uVar8 = local_130->a2;
          uVar9 = local_130->a3;
          uVar10 = local_130->a4;
          uVar11 = local_130->b1;
          uVar12 = local_130->b2;
          uVar13 = local_130->b3;
          uVar14 = local_130->b4;
          uVar15 = local_130->c1;
          uVar16 = local_130->c2;
          uVar17 = local_130->c3;
          uVar18 = local_130->c4;
          uVar19 = local_130->d1;
          uVar20 = local_130->d2;
          uVar21 = local_130->d3;
          uVar22 = local_130->d4;
          local_c8 = ZEXT416((uint)uVar8);
          local_a8 = ZEXT416((uint)uVar9);
          local_158 = fStack_1e4 * (float)uVar10 +
                      fVar52 * (float)uVar9 + fVar45 * (float)uVar7 + fVar40 * (float)uVar8;
          local_98 = fVar39 * (float)uVar9 + fVar55 * (float)uVar7 + fVar53 * (float)uVar8;
          local_e8 = ZEXT416((uint)uVar12);
          local_d8 = ZEXT416((uint)uVar13);
          local_168 = fStack_1e4 * (float)uVar14 +
                      fVar52 * (float)uVar13 + fVar45 * (float)uVar11 + fVar40 * (float)uVar12;
          local_198._4_4_ = fStack_b4;
          local_198._0_4_ = fVar39;
          fStack_190 = fStack_b0;
          local_b8 = fVar39 * (float)uVar13 + fVar55 * (float)uVar11 + fVar53 * (float)uVar12;
          local_f8 = ZEXT416((uint)uVar16);
          local_88 = fStack_1e4 * (float)uVar18 +
                     fVar52 * (float)uVar17 + fVar45 * (float)uVar15 + fVar40 * (float)uVar16;
          local_108 = ZEXT416((uint)uVar20);
          local_1e8 = fStack_1e4 * (float)uVar22 +
                      fVar52 * (float)uVar21 + fVar45 * (float)uVar19 + fVar40 * (float)uVar20;
          uVar6 = local_198._4_8_;
          local_198 = (undefined1  [8])uVar6;
          unique0x10000135 = fStack_1e4;
          local_228._0_8_ =
               CONCAT44((float)uVar10 * fStack_b0 +
                        (float)uVar9 * fStack_1a4 +
                        (float)uVar7 * fStack_144 + (float)uVar8 * fStack_1b4,
                        (float)uVar10 * fStack_b4 +
                        (float)uVar9 * local_1a8 +
                        (float)uVar7 * local_148 + (float)uVar8 * local_1b8);
          local_228._12_4_ = local_98 + (float)uVar10;
          local_228._8_4_ = local_158;
          local_228._16_8_ =
               CONCAT44((float)uVar14 * fStack_b0 +
                        (float)uVar13 * fStack_1a4 +
                        (float)uVar11 * fStack_144 + (float)uVar12 * fStack_1b4,
                        (float)uVar14 * fStack_b4 +
                        (float)uVar13 * local_1a8 +
                        (float)uVar11 * local_148 + (float)uVar12 * local_1b8);
          fStack_20c = local_b8 + (float)uVar14;
          fStack_210 = local_168;
          fStack_204 = (float)uVar18 * fStack_b0 +
                       (float)uVar17 * fStack_1a4 +
                       (float)uVar15 * fStack_144 + (float)uVar16 * fStack_1b4;
          local_208 = (float)uVar18 * fStack_b4 +
                      (float)uVar17 * local_1a8 +
                      (float)uVar15 * local_148 + (float)uVar16 * local_1b8;
          fStack_1fc = fVar39 * (float)uVar17 + fVar55 * (float)uVar15 + fVar53 * (float)uVar16 +
                       (float)uVar18;
          fStack_200 = local_88;
          fStack_1f4 = (float)uVar22 * fStack_b0 +
                       (float)uVar21 * fStack_1a4 +
                       (float)uVar19 * fStack_144 + (float)uVar20 * fStack_1b4;
          local_1f8 = (float)uVar22 * fStack_b4 +
                      (float)uVar21 * local_1a8 +
                      (float)uVar19 * local_148 + (float)uVar20 * local_1b8;
          fStack_1ec = fVar39 * (float)uVar21 + fVar55 * (float)uVar19 + fVar53 * (float)uVar20 +
                       (float)uVar22;
          fStack_1f0 = local_1e8;
          paVar28 = local_1c0->mScene;
          fStack_1e0 = fStack_1e4;
          fStack_1dc = fStack_1e4;
          fStack_164 = fStack_1e4;
          fStack_160 = fStack_1e4;
          fStack_15c = fStack_1e4;
          fStack_154 = fStack_1e4;
          fStack_150 = fStack_1e4;
          fStack_14c = fStack_1e4;
          fStack_ac = fStack_1e4;
          fStack_94 = fStack_b4;
          fStack_90 = fStack_b0;
          fStack_8c = fStack_1e4;
          fStack_84 = fStack_1e4;
          fStack_80 = fStack_1e4;
          fStack_7c = fStack_1e4;
          if (paVar28->mNumMeshes != 0) {
            uVar35 = 0;
            do {
              paVar4 = paVar28->mMeshes[uVar35];
              uVar33 = paVar4->mNumBones;
              if (uVar33 != 0) {
                uVar29 = 0;
                do {
                  paVar5 = paVar4->mBones[uVar29];
                  uVar2 = (paVar5->mName).length;
                  if ((uVar2 == (this_00->mName).length) &&
                     (iVar24 = bcmp((paVar5->mName).data,(this_00->mName).data,(ulong)uVar2),
                     iVar24 == 0)) {
                    local_48 = local_1f8;
                    fStack_44 = fStack_1f4;
                    fStack_40 = fStack_1f0;
                    fStack_3c = fStack_1ec;
                    local_58 = local_208;
                    fStack_54 = fStack_204;
                    fStack_50 = fStack_200;
                    fStack_4c = fStack_1fc;
                    local_68 = local_228._16_8_;
                    fStack_60 = fStack_210;
                    fStack_5c = fStack_20c;
                    local_78 = (pointer)local_228._0_8_;
                    sStack_70 = local_228._8_8_;
                    paVar27 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&local_78);
                    fVar55 = paVar27->a2;
                    fVar53 = paVar27->a3;
                    fVar39 = paVar27->a4;
                    fVar40 = paVar27->b1;
                    fVar41 = paVar27->b2;
                    fVar42 = paVar27->b3;
                    fVar47 = paVar27->b4;
                    fVar43 = paVar27->c1;
                    fVar44 = paVar27->c2;
                    fVar51 = paVar27->c3;
                    fVar45 = paVar27->c4;
                    fVar46 = paVar27->d1;
                    fVar48 = paVar27->d2;
                    fVar49 = paVar27->d3;
                    fVar50 = paVar27->d4;
                    (paVar5->mOffsetMatrix).a1 = paVar27->a1;
                    (paVar5->mOffsetMatrix).a2 = fVar55;
                    (paVar5->mOffsetMatrix).a3 = fVar53;
                    (paVar5->mOffsetMatrix).a4 = fVar39;
                    (paVar5->mOffsetMatrix).b1 = fVar40;
                    (paVar5->mOffsetMatrix).b2 = fVar41;
                    (paVar5->mOffsetMatrix).b3 = fVar42;
                    (paVar5->mOffsetMatrix).b4 = fVar47;
                    (paVar5->mOffsetMatrix).c1 = fVar43;
                    (paVar5->mOffsetMatrix).c2 = fVar44;
                    (paVar5->mOffsetMatrix).c3 = fVar51;
                    (paVar5->mOffsetMatrix).c4 = fVar45;
                    (paVar5->mOffsetMatrix).d1 = fVar46;
                    (paVar5->mOffsetMatrix).d2 = fVar48;
                    (paVar5->mOffsetMatrix).d3 = fVar49;
                    (paVar5->mOffsetMatrix).d4 = fVar50;
                    uVar33 = paVar4->mNumBones;
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 < uVar33);
                paVar28 = local_1c0->mScene;
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 < paVar28->mNumMeshes);
          }
          pvVar38 = local_1c8;
          pvVar23 = local_1d8;
          local_1d0 = (ulong)((int)local_1d0 + 1);
          puVar1 = (ulong *)((long)(local_1c8->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            local_118 * 8 + -8 + local_110);
          *puVar1 = *puVar1 | local_120;
          CollectChildJoints(local_1c0,local_1d8,local_1c8,this_00,(aiMatrix4x4 *)local_228);
          pTVar34 = (pvVar23->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pTVar31 = (pvVar23->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          uVar35 = local_178;
          paVar36 = local_180;
        }
      }
      uVar29 = local_170 + 1;
    } while (uVar29 < (ulong)(((long)pTVar31 - (long)pTVar34 >> 4) * 0x2e8ba2e8ba2e8ba3));
  }
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints,
    std::vector<bool>& hadit,
    aiNode* nd,
    const aiMatrix4x4& absTrafo)
{
    unsigned int cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            ++cnt;
        }
    }

    nd->mChildren = new aiNode*[nd->mNumChildren = cnt];
    cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            aiNode* ch = nd->mChildren[cnt++] = new aiNode(joints[i].name);
            ch->mParent = nd;

            ch->mTransformation = aiMatrix4x4::Translation(joints[i].position,aiMatrix4x4()=aiMatrix4x4())*
                aiMatrix4x4().FromEulerAnglesXYZ(joints[i].rotation);

            const aiMatrix4x4 abs = absTrafo*ch->mTransformation;
            for(unsigned int a = 0; a < mScene->mNumMeshes; ++a) {
                aiMesh* const msh = mScene->mMeshes[a];
                for(unsigned int n = 0; n < msh->mNumBones; ++n) {
                    aiBone* const bone = msh->mBones[n];

                    if(bone->mName == ch->mName) {
                        bone->mOffsetMatrix = aiMatrix4x4(abs).Inverse();
                    }
                }
            }

            hadit[i] = true;
            CollectChildJoints(joints,hadit,ch,abs);
        }
    }
}